

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_dispatcher_template.hpp
# Opt level: O2

void __thiscall
so_5::disp::reuse::
proxy_dispatcher_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::actual_disp_iface_t,_so_5::disp::prio_one_thread::quoted_round_robin::disp_params_t>
::modify_disp_params
          (proxy_dispatcher_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::actual_disp_iface_t,_so_5::disp::prio_one_thread::quoted_round_robin::disp_params_t>
           *this,environment_t *env)

{
  long lVar1;
  queue_params_t *__x;
  queue_params_t queue_params;
  lock_factory_t lf;
  _Any_data local_98;
  long local_88;
  undefined8 local_80;
  _Any_data local_78;
  long local_68;
  undefined8 uStack_60;
  function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
  local_58;
  lock_factory_t local_38;
  
  __x = &(this->m_disp_params).m_queue_params;
  std::
  function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
  ::function(&local_58,&__x->m_lock_factory);
  if (local_58.super__Function_base._M_manager == (_Manager_type)0x0) {
    std::
    function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
    ::function((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
                *)&local_78,&__x->m_lock_factory);
    impl::default_lock_factory(&local_38,env,&local_58);
    std::
    function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
    ::operator=((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
                 *)&local_78,&local_38);
    std::_Function_base::~_Function_base(&local_38.super__Function_base);
    lVar1 = local_68;
    local_88 = 0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_80 = uStack_60;
    if (local_68 != 0) {
      local_68 = 0;
      uStack_60 = 0;
      local_98._M_unused._M_object = local_78._M_unused._M_object;
      local_98._8_8_ = local_78._8_8_;
      local_88 = lVar1;
    }
    mpsc_queue_traits::queue_params_t::operator=(__x,(queue_params_t *)&local_98);
    std::_Function_base::~_Function_base((_Function_base *)&local_98);
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
  }
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  return;
}

Assistant:

void
		modify_disp_params( so_5::environment_t & env )
			{
				auto lf = m_disp_params.queue_params().lock_factory();
				if( !lf )
				{
					auto queue_params = m_disp_params.queue_params();
					queue_params.lock_factory(
							so_5::impl::default_lock_factory( env, lf ) );
					m_disp_params.set_queue_params( std::move(queue_params) );
				}
			}